

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::TryMarkInterior(Recycler *this,void *candidate,void *parentReference)

{
  size_t *psVar1;
  Node *pNVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  
  if (this->isHeapEnumInProgress == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x853,"(!isHeapEnumInProgress)","!isHeapEnumInProgress");
    if (!bVar4) goto LAB_0070cbfc;
    *puVar5 = 0;
  }
  if ((this->collectionState).value == CollectionStateParallelMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x855,"(this->collectionState != CollectionStateParallelMark)",
                       "this->collectionState != CollectionStateParallelMark");
    if (!bVar4) goto LAB_0070cbfc;
    *puVar5 = 0;
  }
  pRVar6 = (this->markContext).recycler;
  if (pRVar6->isProcessingRescan == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.inl"
                       ,0xa3,"(!recycler->isProcessingRescan)","!recycler->isProcessingRescan");
    if (!bVar4) {
LAB_0070cbfc:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    pRVar6 = (this->markContext).recycler;
  }
  if (candidate < (void *)0x10000) {
    LOCK();
    psVar1 = &(pRVar6->collectionStats).tryMarkNullCount;
    *(int *)psVar1 = (int)*psVar1 + 1;
    UNLOCK();
  }
  else {
    for (pNVar2 = (pRVar6->heapBlockMap).list; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->next) {
      if (pNVar2->nodeIndex == (uint)((ulong)candidate >> 0x20)) {
        HeapBlockMap32::MarkInterior<false,false>(&pNVar2->map,candidate,&this->markContext);
        return;
      }
    }
  }
  return;
}

Assistant:

void
Recycler::TryMarkInterior(void* candidate, void* parentReference)
{
#ifdef HEAP_ENUMERATION_VALIDATION
    Assert(!isHeapEnumInProgress || this->IsPostEnumHeapValidationInProgress());
#else
    Assert(!isHeapEnumInProgress);
#endif
    Assert(this->collectionState != CollectionStateParallelMark);
    markContext.Mark</*parallel */ false, /* interior */ true, /* doSpecialMark */ false>(candidate, parentReference);
}